

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_p.c
# Opt level: O0

void test_p(void)

{
  wchar_t wVar1;
  int r;
  char *reffile;
  
  extract_reference_file("test_basic.zip");
  wVar1 = systemf("%s -p %s >test.out 2>test.err",testprog,"test_basic.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_p.c"
                      ,L'\x11',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_p.c"
             ,L'\x12',"contents a\ncontents b\ncontents c\ncontents CAPS\n","test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_p.c"
             ,L'\x13',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_p)
{
	const char *reffile = "test_basic.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s -p %s >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertTextFileContents("contents a\ncontents b\ncontents c\ncontents CAPS\n", "test.out");
	assertEmptyFile("test.err");
}